

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * substExpr(SubstContext *pSubst,Expr *pExpr)

{
  short sVar1;
  sqlite3 *db_00;
  Window *pWVar2;
  int iVar3;
  CollSeq *pCVar4;
  CollSeq *pCVar5;
  Expr *pEVar6;
  char *local_b8;
  Window *pWin;
  CollSeq *pColl;
  CollSeq *pNat;
  sqlite3 *db;
  Expr ifNullRow;
  Expr *pCopy;
  int iColumn;
  Expr *pNew;
  Expr *pExpr_local;
  SubstContext *pSubst_local;
  
  if (pExpr == (Expr *)0x0) {
    pSubst_local = (SubstContext *)0x0;
  }
  else {
    if (((pExpr->flags & 3) != 0) && ((pExpr->w).iJoin == pSubst->iTable)) {
      pExpr->w = (anon_union_4_2_009eaf8f_for_w)pSubst->iNewTable;
    }
    pNew = pExpr;
    if (((pExpr->op == 0xa7) && (pExpr->iTable == pSubst->iTable)) && ((pExpr->flags & 0x20) == 0))
    {
      sVar1 = pExpr->iColumn;
      ifNullRow.y = *(anon_union_8_3_c79b3df9_for_y *)(pSubst->pEList->a + (int)sVar1);
      iVar3 = sqlite3ExprIsVector((Expr *)ifNullRow.y.pTab);
      if (iVar3 == 0) {
        db_00 = pSubst->pParse->db;
        if ((pSubst->isOuterJoin != 0) &&
           ((*(char *)&(ifNullRow.y.pTab)->zName != -0x59 ||
            ((ifNullRow.y.pTab)->nTabRef != pSubst->iNewTable)))) {
          memset(&db,0,0x48);
          db._0_1_ = 0xb3;
          ifNullRow.u = (anon_union_8_2_443a03b8_for_u)ifNullRow.y;
          ifNullRow.x._4_4_ = pSubst->iNewTable;
          ifNullRow.nHeight._0_2_ = 0xff9d;
          db._4_4_ = 0x40000;
          ifNullRow.y.pTab = (Table *)&db;
        }
        pNew = sqlite3ExprDup(db_00,(Expr *)ifNullRow.y.pTab,0);
        if (db_00->mallocFailed != '\0') {
          sqlite3ExprDelete(db_00,pNew);
          return pExpr;
        }
        if (pSubst->isOuterJoin != 0) {
          pNew->flags = pNew->flags | 0x200000;
        }
        if ((pExpr->flags & 3) != 0) {
          sqlite3SetJoinExpr(pNew,(pExpr->w).iJoin,pExpr->flags & 3);
        }
        sqlite3ExprDelete(db_00,pExpr);
        if (pNew->op == 0xaa) {
          iVar3 = sqlite3ExprTruthValue(pNew);
          (pNew->u).iValue = iVar3;
          pNew->op = 0x9b;
          pNew->flags = pNew->flags | 0x800;
        }
        pCVar4 = sqlite3ExprCollSeq(pSubst->pParse,pNew);
        pCVar5 = sqlite3ExprCollSeq(pSubst->pParse,pSubst->pCList->a[(int)sVar1].pExpr);
        if ((pCVar4 != pCVar5) || ((pNew->op != 0xa7 && (pNew->op != 'q')))) {
          if (pCVar5 == (CollSeq *)0x0) {
            local_b8 = "BINARY";
          }
          else {
            local_b8 = pCVar5->zName;
          }
          pNew = sqlite3ExprAddCollateString(pSubst->pParse,pNew,local_b8);
        }
        pNew->flags = pNew->flags & 0xfffffdff;
      }
      else {
        sqlite3VectorErrorMsg(pSubst->pParse,(Expr *)ifNullRow.y.pTab);
      }
    }
    else {
      if ((pExpr->op == 0xb3) && (pExpr->iTable == pSubst->iTable)) {
        pExpr->iTable = pSubst->iNewTable;
      }
      pEVar6 = substExpr(pSubst,pExpr->pLeft);
      pExpr->pLeft = pEVar6;
      pEVar6 = substExpr(pSubst,pExpr->pRight);
      pExpr->pRight = pEVar6;
      if ((pExpr->flags & 0x1000) == 0) {
        substExprList(pSubst,(pExpr->x).pList);
      }
      else {
        substSelect(pSubst,(pExpr->x).pSelect,1);
      }
      if ((pExpr->flags & 0x1000000) != 0) {
        pWVar2 = (pExpr->y).pWin;
        pEVar6 = substExpr(pSubst,pWVar2->pFilter);
        pWVar2->pFilter = pEVar6;
        substExprList(pSubst,pWVar2->pPartition);
        substExprList(pSubst,pWVar2->pOrderBy);
      }
    }
    pSubst_local = (SubstContext *)pNew;
  }
  return (Expr *)pSubst_local;
}

Assistant:

static Expr *substExpr(
  SubstContext *pSubst,  /* Description of the substitution */
  Expr *pExpr            /* Expr in which substitution occurs */
){
  if( pExpr==0 ) return 0;
  if( ExprHasProperty(pExpr, EP_OuterON|EP_InnerON)
   && pExpr->w.iJoin==pSubst->iTable
  ){
    testcase( ExprHasProperty(pExpr, EP_InnerON) );
    pExpr->w.iJoin = pSubst->iNewTable;
  }
  if( pExpr->op==TK_COLUMN
   && pExpr->iTable==pSubst->iTable
   && !ExprHasProperty(pExpr, EP_FixedCol)
  ){
#ifdef SQLITE_ALLOW_ROWID_IN_VIEW
    if( pExpr->iColumn<0 ){
      pExpr->op = TK_NULL;
    }else
#endif
    {
      Expr *pNew;
      int iColumn;
      Expr *pCopy;
      Expr ifNullRow;
      iColumn = pExpr->iColumn;
      assert( iColumn>=0 );
      assert( pSubst->pEList!=0 && iColumn<pSubst->pEList->nExpr );
      assert( pExpr->pRight==0 );
      pCopy = pSubst->pEList->a[iColumn].pExpr;
      if( sqlite3ExprIsVector(pCopy) ){
        sqlite3VectorErrorMsg(pSubst->pParse, pCopy);
      }else{
        sqlite3 *db = pSubst->pParse->db;
        if( pSubst->isOuterJoin
         && (pCopy->op!=TK_COLUMN || pCopy->iTable!=pSubst->iNewTable)
        ){
          memset(&ifNullRow, 0, sizeof(ifNullRow));
          ifNullRow.op = TK_IF_NULL_ROW;
          ifNullRow.pLeft = pCopy;
          ifNullRow.iTable = pSubst->iNewTable;
          ifNullRow.iColumn = -99;
          ifNullRow.flags = EP_IfNullRow;
          pCopy = &ifNullRow;
        }
        testcase( ExprHasProperty(pCopy, EP_Subquery) );
        pNew = sqlite3ExprDup(db, pCopy, 0);
        if( db->mallocFailed ){
          sqlite3ExprDelete(db, pNew);
          return pExpr;
        }
        if( pSubst->isOuterJoin ){
          ExprSetProperty(pNew, EP_CanBeNull);
        }
        if( ExprHasProperty(pExpr,EP_OuterON|EP_InnerON) ){
          sqlite3SetJoinExpr(pNew, pExpr->w.iJoin,
                             pExpr->flags & (EP_OuterON|EP_InnerON));
        }
        sqlite3ExprDelete(db, pExpr);
        pExpr = pNew;
        if( pExpr->op==TK_TRUEFALSE ){
          pExpr->u.iValue = sqlite3ExprTruthValue(pExpr);
          pExpr->op = TK_INTEGER;
          ExprSetProperty(pExpr, EP_IntValue);
        }

        /* Ensure that the expression now has an implicit collation sequence,
        ** just as it did when it was a column of a view or sub-query. */
        {
          CollSeq *pNat = sqlite3ExprCollSeq(pSubst->pParse, pExpr);
          CollSeq *pColl = sqlite3ExprCollSeq(pSubst->pParse,
                pSubst->pCList->a[iColumn].pExpr
          );
          if( pNat!=pColl || (pExpr->op!=TK_COLUMN && pExpr->op!=TK_COLLATE) ){
            pExpr = sqlite3ExprAddCollateString(pSubst->pParse, pExpr,
                (pColl ? pColl->zName : "BINARY")
            );
          }
        }
        ExprClearProperty(pExpr, EP_Collate);
      }
    }
  }else{
    if( pExpr->op==TK_IF_NULL_ROW && pExpr->iTable==pSubst->iTable ){
      pExpr->iTable = pSubst->iNewTable;
    }
    pExpr->pLeft = substExpr(pSubst, pExpr->pLeft);
    pExpr->pRight = substExpr(pSubst, pExpr->pRight);
    if( ExprUseXSelect(pExpr) ){
      substSelect(pSubst, pExpr->x.pSelect, 1);
    }else{
      substExprList(pSubst, pExpr->x.pList);
    }
#ifndef SQLITE_OMIT_WINDOWFUNC
    if( ExprHasProperty(pExpr, EP_WinFunc) ){
      Window *pWin = pExpr->y.pWin;
      pWin->pFilter = substExpr(pSubst, pWin->pFilter);
      substExprList(pSubst, pWin->pPartition);
      substExprList(pSubst, pWin->pOrderBy);
    }
#endif
  }
  return pExpr;
}